

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::ParseCertificatePoliciesExtensionOidsTest_OnePolicy_Test::TestBody
          (ParseCertificatePoliciesExtensionOidsTest_OnePolicy_Test *this)

{
  Input extension_value;
  bool bVar1;
  ParamType *pPVar2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> policies;
  CertErrors errors;
  string der;
  AssertHelper local_b0;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_70;
  pointer local_68;
  AssertHelper local_60;
  CertErrors local_58;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_98 = (undefined1  [8])&local_88;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"policy_1_2_3.pem","");
  LoadTestData((anon_unknown_0 *)local_78,(string *)local_98,&local_40);
  if (local_98 != (undefined1  [8])&local_88) {
    operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
  }
  if (local_78[0] == (anon_unknown_0)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)local_78,
               (AssertionResult *)"LoadTestData(\"policy_1_2_3.pem\", &der)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0x6f,(char *)local_98);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if (local_98 != (undefined1  [8])&local_88) {
      operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
    }
    if (local_58.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_58.nodes_.
                            super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_70,pbStack_70);
    }
    goto LAB_002143db;
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  local_78 = (undefined1  [8])0x0;
  pbStack_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_68 = (pointer)0x0;
  CertErrors::CertErrors(&local_58);
  extension_value.data_.size_ = local_40._M_string_length;
  extension_value.data_.data_ = (uchar *)local_40._M_dataplus._M_p;
  pPVar2 = testing::WithParamInterface<bool>::GetParam();
  bVar1 = ParseCertificatePoliciesExtensionOids
                    (extension_value,*pPVar2,
                     (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)local_78,
                     &local_58);
  local_a8[0] = bVar1;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)local_a8,
               (AssertionResult *)
               "ParseCertificatePoliciesExtensionOids( StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies, &errors)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0x74,(char *)local_98);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_98 != (undefined1  [8])&local_88) {
      operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
  }
  local_b0.data_._0_4_ = 1;
  local_a8 = (undefined1  [8])((long)pbStack_70 - (long)local_78 >> 4);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_98,"1U","policies.size()",(uint *)&local_b0,(unsigned_long *)local_a8
            );
  if (local_98[0] == (string)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0x75,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)local_a8);
LAB_0021438c:
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a8 + 8))();
    }
  }
  else {
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    local_a8 = (undefined1  [8])&(anonymous_namespace)::policy_1_2_3_der;
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
    testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
              ((internal *)local_98,"der::Input(policy_1_2_3_der)","policies[0]",(Input *)local_a8,
               (Input *)local_78);
    if (local_98[0] == (string)0x0) {
      testing::Message::Message((Message *)local_a8);
      if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x76,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)local_a8);
      goto LAB_0021438c;
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  CertErrors::~CertErrors(&local_58);
  if (local_78 != (undefined1  [8])0x0) {
    operator_delete((void *)local_78,(long)local_68 - (long)local_78);
  }
LAB_002143db:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest, TwoPolicies) {
  std::string der;
  ASSERT_TRUE(LoadTestData("policy_1_2_3_and_1_2_4.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  EXPECT_TRUE(ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors));
  ASSERT_EQ(2U, policies.size());
  EXPECT_EQ(der::Input(policy_1_2_3_der), policies[0]);
  EXPECT_EQ(der::Input(policy_1_2_4_der), policies[1]);
}